

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlChar * xmlSchemaLookupNamespace(xmlSchemaValidCtxtPtr vctxt,xmlChar *prefix)

{
  xmlSchemaNodeInfoPtr pxVar1;
  int iVar2;
  xmlChar *name;
  xmlNsPtr pxVar3;
  xmlNsPtr ns;
  xmlChar *ret;
  xmlChar *nsName;
  xmlSchemaNodeInfoPtr inode;
  int j;
  int i;
  xmlChar *prefix_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt->sax == (xmlSAXHandlerPtr)0x0) {
    if (vctxt->reader == (xmlTextReaderPtr)0x0) {
      if ((vctxt->inode->node == (xmlNodePtr)0x0) || (vctxt->inode->node->doc == (_xmlDoc *)0x0)) {
        xmlSchemaInternalErr
                  ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaLookupNamespace",
                   "no node or node\'s doc available");
        vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
      }
      else {
        pxVar3 = xmlSearchNs(vctxt->inode->node->doc,vctxt->inode->node,prefix);
        if (pxVar3 == (xmlNsPtr)0x0) {
          vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
        }
        else {
          vctxt_local = (xmlSchemaValidCtxtPtr)pxVar3->href;
        }
      }
    }
    else {
      name = xmlTextReaderLookupNamespace(vctxt->reader,prefix);
      if (name == (xmlChar *)0x0) {
        vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
      }
      else {
        vctxt_local = (xmlSchemaValidCtxtPtr)xmlDictLookup(vctxt->dict,name,-1);
        (*xmlFree)(name);
      }
    }
  }
  else {
    for (inode._4_4_ = vctxt->depth; -1 < inode._4_4_; inode._4_4_ = inode._4_4_ + -1) {
      if (vctxt->elemInfos[inode._4_4_]->nbNsBindings != 0) {
        pxVar1 = vctxt->elemInfos[inode._4_4_];
        for (inode._0_4_ = 0;
            SBORROW4((int)inode,pxVar1->nbNsBindings * 2) !=
            (int)inode + pxVar1->nbNsBindings * -2 < 0; inode._0_4_ = (int)inode + 2) {
          if (((prefix == (xmlChar *)0x0) && (pxVar1->nsBindings[(int)inode] == (xmlChar *)0x0)) ||
             ((prefix != (xmlChar *)0x0 &&
              (iVar2 = xmlStrEqual(prefix,pxVar1->nsBindings[(int)inode]), iVar2 != 0)))) {
            return pxVar1->nsBindings[(int)inode + 1];
          }
        }
      }
    }
    vctxt_local = (xmlSchemaValidCtxtPtr)0x0;
  }
  return (xmlChar *)vctxt_local;
}

Assistant:

static const xmlChar *
xmlSchemaLookupNamespace(xmlSchemaValidCtxtPtr vctxt,
			 const xmlChar *prefix)
{
    if (vctxt->sax != NULL) {
	int i, j;
	xmlSchemaNodeInfoPtr inode;

	for (i = vctxt->depth; i >= 0; i--) {
	    if (vctxt->elemInfos[i]->nbNsBindings != 0) {
		inode = vctxt->elemInfos[i];
		for (j = 0; j < inode->nbNsBindings * 2; j += 2) {
		    if (((prefix == NULL) &&
			    (inode->nsBindings[j] == NULL)) ||
			((prefix != NULL) && xmlStrEqual(prefix,
			    inode->nsBindings[j]))) {

			/*
			* Note that the namespace bindings are already
			* in a string dict.
			*/
			return (inode->nsBindings[j+1]);
		    }
		}
	    }
	}
	return (NULL);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	xmlChar *nsName;

	nsName = xmlTextReaderLookupNamespace(vctxt->reader, prefix);
	if (nsName != NULL) {
	    const xmlChar *ret;

	    ret = xmlDictLookup(vctxt->dict, nsName, -1);
	    xmlFree(nsName);
	    return (ret);
	} else
	    return (NULL);
#endif
    } else {
	xmlNsPtr ns;

	if ((vctxt->inode->node == NULL) ||
	    (vctxt->inode->node->doc == NULL)) {
	    VERROR_INT("xmlSchemaLookupNamespace",
		"no node or node's doc available");
	    return (NULL);
	}
	ns = xmlSearchNs(vctxt->inode->node->doc,
	    vctxt->inode->node, prefix);
	if (ns != NULL)
	    return (ns->href);
	return (NULL);
    }
}